

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall FBehavior::LoadScriptsDirectory(FBehavior *this)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  BYTE *pBVar5;
  ulong *puVar6;
  BYTE *pBVar7;
  ulong uVar8;
  ulong uVar9;
  ScriptPtr *pSVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  FBehavior *this_00;
  ACSFormat AVar14;
  long lVar15;
  uint uVar16;
  WORD *pWVar17;
  FName name;
  FString local_38;
  
  this->NumScripts = 0;
  this->Scripts = (ScriptPtr *)0x0;
  AVar14 = this->Format;
  if (AVar14 - ACS_Enhanced < 2) {
    pBVar5 = FindChunk(this,0x52545053);
    if (pBVar5 == (BYTE *)0x0) goto LAB_003c5926;
    uVar2 = *(uint *)(pBVar5 + 4);
    if (*(int *)this->Data == 0x534341) {
      uVar16 = uVar2 >> 3;
      uVar12 = (ulong)uVar16;
      this->NumScripts = uVar16;
      puVar6 = (ulong *)operator_new__(uVar12 * 0x38 + 8);
      *puVar6 = uVar12;
      pSVar10 = (ScriptPtr *)(puVar6 + 1);
      if (7 < uVar2) {
        lVar13 = 0;
        do {
          *(undefined4 *)((long)puVar6 + lVar13 + 0x18) = 0;
          *(undefined4 *)((long)puVar6 + lVar13 + 0x30) = 0;
          puVar1 = (undefined8 *)((long)puVar6 + lVar13 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)puVar6 + lVar13 + 0x34) = 0xffffffff;
          lVar13 = lVar13 + 0x38;
        } while (uVar12 * 0x38 - lVar13 != 0);
      }
      this->Scripts = pSVar10;
      pBVar7 = (BYTE *)((long)puVar6 + 0x11);
      for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
        *(int *)(pBVar7 + -9) = (int)*(short *)(pBVar5 + uVar11 * 8 + 8);
        pBVar7[-1] = pBVar5[uVar11 * 8 + 10];
        *pBVar7 = pBVar5[uVar11 * 8 + 0xb];
        *(undefined4 *)(pBVar7 + -5) = *(undefined4 *)(pBVar5 + uVar11 * 8 + 0xc);
        pBVar7 = pBVar7 + 0x38;
      }
    }
    else {
      uVar12 = (ulong)uVar2 / 0xc;
      uVar16 = (uint)uVar12;
      this->NumScripts = uVar16;
      puVar6 = (ulong *)operator_new__(uVar12 * 0x38 + 8);
      *puVar6 = uVar12;
      pSVar10 = (ScriptPtr *)(puVar6 + 1);
      if (0xb < uVar2) {
        lVar13 = 0;
        do {
          *(undefined4 *)((long)puVar6 + lVar13 + 0x18) = 0;
          *(undefined4 *)((long)puVar6 + lVar13 + 0x30) = 0;
          puVar1 = (undefined8 *)((long)puVar6 + lVar13 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)puVar6 + lVar13 + 0x34) = 0xffffffff;
          lVar13 = lVar13 + 0x38;
        } while (uVar12 * 0x38 - lVar13 != 0);
      }
      this->Scripts = pSVar10;
      pBVar7 = (BYTE *)((long)puVar6 + 0x11);
      for (lVar13 = 0; uVar12 * 0xc - lVar13 != 0; lVar13 = lVar13 + 0xc) {
        *(int *)(pBVar7 + -9) = (int)*(short *)(pBVar5 + lVar13 + 8);
        pBVar7[-1] = pBVar5[lVar13 + 10];
        *pBVar7 = pBVar5[lVar13 + 0x10];
        *(undefined4 *)(pBVar7 + -5) = *(undefined4 *)(pBVar5 + lVar13 + 0xc);
        pBVar7 = pBVar7 + 0x38;
      }
    }
  }
  else {
    if (AVar14 == ACS_Old) {
      pBVar5 = this->Data;
      uVar12 = (ulong)*(uint *)(pBVar5 + 4);
      uVar16 = *(uint *)(pBVar5 + uVar12);
      uVar11 = (ulong)(int)uVar16;
      this->NumScripts = uVar16;
      if (uVar11 != 0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar11;
        uVar8 = SUB168(auVar3 * ZEXT816(0x38),0);
        uVar9 = uVar8 + 8;
        if (0xfffffffffffffff7 < uVar8) {
          uVar9 = 0xffffffffffffffff;
        }
        uVar8 = 0xffffffffffffffff;
        if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
          uVar8 = uVar9;
        }
        puVar6 = (ulong *)operator_new__(uVar8);
        *puVar6 = uVar11;
        pSVar10 = (ScriptPtr *)(puVar6 + 1);
        lVar13 = 0;
        do {
          *(undefined4 *)((long)puVar6 + lVar13 + 0x18) = 0;
          *(undefined4 *)((long)puVar6 + lVar13 + 0x30) = 0;
          puVar1 = (undefined8 *)((long)puVar6 + lVar13 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)puVar6 + lVar13 + 0x34) = 0xffffffff;
          lVar13 = lVar13 + 0x38;
        } while (uVar11 * 0x38 - lVar13 != 0);
        this->Scripts = pSVar10;
        lVar13 = 0;
        uVar11 = 0;
        if (0 < (int)uVar16) {
          uVar11 = (ulong)uVar16;
        }
        pBVar7 = (BYTE *)((long)puVar6 + 0x11);
        for (; uVar11 * 0xc - lVar13 != 0; lVar13 = lVar13 + 0xc) {
          uVar2 = *(uint *)(pBVar5 + lVar13 + uVar12 + 4);
          *(uint *)(pBVar7 + -9) = uVar2 % 1000;
          pBVar7[-1] = (BYTE)((ulong)uVar2 / 1000);
          *pBVar7 = pBVar5[lVar13 + uVar12 + 0xc];
          *(undefined4 *)(pBVar7 + -5) = *(undefined4 *)(pBVar5 + lVar13 + uVar12 + 8);
          pBVar7 = pBVar7 + 0x38;
        }
        goto LAB_003c592b;
      }
    }
LAB_003c5926:
    pSVar10 = (ScriptPtr *)0x0;
    uVar16 = 0;
  }
LAB_003c592b:
  lVar13 = 0;
  uVar12 = 0;
  if (0 < (int)uVar16) {
    uVar12 = (ulong)uVar16;
  }
  for (; uVar12 * 0x38 - lVar13 != 0; lVar13 = lVar13 + 0x38) {
    *(undefined4 *)((long)&pSVar10->VarCount + lVar13) = 0x14;
  }
  if (1 < (int)uVar16) {
    lVar13 = 0x38;
    qsort(pSVar10,(ulong)uVar16,0x38,SortScripts);
    if (this->Format != ACS_Old) goto LAB_003c5a04;
    for (lVar15 = 0; lVar15 < (long)this->NumScripts + -1; lVar15 = lVar15 + 1) {
      if (*(int *)((long)&this->Scripts[-1].Number + lVar13) ==
          *(int *)((long)&this->Scripts->Number + lVar13)) {
        ScriptPresentation((int)&local_38);
        Printf("\x1cI%s appears more than once.\n",local_38.Chars);
        FString::~FString(&local_38);
        pSVar10 = this->Scripts;
        if ((&pSVar10->Type)[lVar13] == '\0') {
          swapvalues<ScriptPtr>
                    ((ScriptPtr *)((long)&pSVar10[-1].Number + lVar13),
                     (ScriptPtr *)((long)&pSVar10->Number + lVar13));
        }
      }
      lVar13 = lVar13 + 0x38;
    }
    AVar14 = this->Format;
  }
  if (AVar14 == ACS_Old) {
    return;
  }
LAB_003c5a04:
  pBVar5 = FindChunk(this,0x474c4653);
  if (pBVar5 != (BYTE *)0x0) {
    pWVar17 = (WORD *)(pBVar5 + 10);
    for (uVar16 = *(uint *)(pBVar5 + 4) >> 2; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
      pSVar10 = FindScript(this,(int)(short)pWVar17[-1]);
      if (pSVar10 != (ScriptPtr *)0x0) {
        pSVar10->Flags = *pWVar17;
      }
      pWVar17 = pWVar17 + 2;
    }
  }
  pBVar5 = FindChunk(this,0x54435653);
  if (pBVar5 != (BYTE *)0x0) {
    pWVar17 = (WORD *)(pBVar5 + 10);
    for (uVar16 = *(uint *)(pBVar5 + 4) >> 2; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
      pSVar10 = FindScript(this,(int)(short)pWVar17[-1]);
      if (pSVar10 != (ScriptPtr *)0x0) {
        pSVar10->VarCount = *pWVar17;
      }
      pWVar17 = pWVar17 + 2;
    }
  }
  for (pBVar5 = FindChunk(this,0x59524153); pBVar5 != (BYTE *)0x0; pBVar5 = NextChunk(this,pBVar5))
  {
    if ((5 < *(int *)(pBVar5 + 4)) &&
       (pSVar10 = FindScript(this,(int)*(short *)(pBVar5 + 8)), pSVar10 != (ScriptPtr *)0x0)) {
      iVar4 = ParseLocalArrayChunk(pBVar5,&pSVar10->LocalArrays,(uint)pSVar10->VarCount);
      pSVar10->VarCount = (WORD)iVar4;
    }
  }
  this_00 = this;
  pBVar5 = FindChunk(this,0x4d414e53);
  if (pBVar5 != (BYTE *)0x0) {
    lVar15 = 0;
    UnescapeStringTable(this_00,pBVar5 + 8,(BYTE *)0x0,false);
    lVar13 = 0;
    while( true ) {
      if (this->NumScripts <= lVar13) break;
      iVar4 = *(int *)((long)&this->Scripts->Number + lVar15);
      if (iVar4 < 0) {
        FName::FName(&name,(char *)(pBVar5 + 8 + *(uint *)(pBVar5 + (ulong)(2 - iVar4) * 4)));
        *(int *)((long)&this->Scripts->Number + lVar15) = -name.Index;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x38;
    }
    qsort(this->Scripts,(long)this->NumScripts,0x38,SortScripts);
  }
  return;
}

Assistant:

void FBehavior::LoadScriptsDirectory ()
{
	union
	{
		BYTE *b;
		DWORD *dw;
		WORD *w;
		SWORD *sw;
		ScriptPtr2 *po;		// Old
		ScriptPtr1 *pi;		// Intermediate
		ScriptPtr3 *pe;		// LittleEnhanced
	} scripts;
	int i, max;

	NumScripts = 0;
	Scripts = NULL;

	// Load the main script directory
	switch (Format)
	{
	case ACS_Old:
		scripts.dw = (DWORD *)(Data + LittleLong(((DWORD *)Data)[1]));
		NumScripts = LittleLong(scripts.dw[0]);
		if (NumScripts != 0)
		{
			scripts.dw++;

			Scripts = new ScriptPtr[NumScripts];

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr2 *ptr1 = &scripts.po[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleLong(ptr1->Number) % 1000;
				ptr2->Type = LittleLong(ptr1->Number) / 1000;
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	case ACS_Enhanced:
	case ACS_LittleEnhanced:
		scripts.b = FindChunk (MAKE_ID('S','P','T','R'));
		if (scripts.b == NULL)
		{
			// There are no scripts!
		}
		else if (*(DWORD *)Data != MAKE_ID('A','C','S',0))
		{
			NumScripts = LittleLong(scripts.dw[1]) / 12;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr1 *ptr1 = &scripts.pi[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = BYTE(LittleShort(ptr1->Type));
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		else
		{
			NumScripts = LittleLong(scripts.dw[1]) / 8;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr3 *ptr1 = &scripts.pe[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = ptr1->Type;
				ptr2->ArgCount = ptr1->ArgCount;
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	default:
		break;
	}

// [EP] Clang 3.5.0 optimizer miscompiles this function and causes random
// crashes in the program. This is fixed in 3.5.1 onwards.
#if defined(__clang__) && __clang_major__ == 3 && __clang_minor__ == 5 && __clang_patchlevel__ == 0
	asm("" : "+g" (NumScripts));
#endif
	for (i = 0; i < NumScripts; ++i)
	{
		Scripts[i].Flags = 0;
		Scripts[i].VarCount = LOCAL_SIZE;
	}

	// Sort scripts, so we can use a binary search to find them
	if (NumScripts > 1)
	{
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
		// Check for duplicates because ACC originally did not enforce
		// script number uniqueness across different script types. We
		// only need to do this for old format lumps, because the ACCs
		// that produce new format lumps won't let you do this.
		if (Format == ACS_Old)
		{
			for (i = 0; i < NumScripts - 1; ++i)
			{
				if (Scripts[i].Number == Scripts[i+1].Number)
				{
					Printf(TEXTCOLOR_ORANGE "%s appears more than once.\n",
						ScriptPresentation(Scripts[i].Number).GetChars());
					// Make the closed version the first one.
					if (Scripts[i+1].Type == SCRIPT_Closed)
					{
						swapvalues(Scripts[i], Scripts[i+1]);
					}
				}
			}
		}
	}

	if (Format == ACS_Old)
		return;

	// Load script flags
	scripts.b = FindChunk (MAKE_ID('S','F','L','G'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->Flags = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script var counts. (Only recorded for scripts that use more than LOCAL_SIZE variables.)
	scripts.b = FindChunk (MAKE_ID('S','V','C','T'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->VarCount = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script array sizes. (One chunk per script that uses arrays.)
	for (scripts.b = FindChunk(MAKE_ID('S','A','R','Y')); scripts.dw != NULL; scripts.b = NextChunk(scripts.b))
	{
		int size = LittleLong(scripts.dw[1]);
		if (size >= 6)
		{
			int script_num = LittleShort(scripts.sw[4]);
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript(script_num));
			if (ptr != NULL)
			{
				ptr->VarCount = ParseLocalArrayChunk(scripts.b, &ptr->LocalArrays, ptr->VarCount);
			}
		}
	}

	// Load script names (if any)
	scripts.b = FindChunk(MAKE_ID('S','N','A','M'));
	if (scripts.dw != NULL)
	{
		UnescapeStringTable(scripts.b + 8, NULL, false);
		for (i = 0; i < NumScripts; ++i)
		{
			// ACC stores script names as an index into the SNAM chunk, with the first index as
			// -1 and counting down from there. We convert this from an index into SNAM into
			// a negative index into the global name table.
			if (Scripts[i].Number < 0)
			{
				const char *str = (const char *)(scripts.b + 8 + scripts.dw[3 + (-Scripts[i].Number - 1)]);
				FName name(str);
				Scripts[i].Number = -name;
			}
		}
		// We need to resort scripts, because the new numbers for named scripts likely
		// do not match the order they were originally in.
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
	}
}